

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

void __thiscall
HullLibrary::BringOutYourDead
          (HullLibrary *this,cbtVector3 *verts,uint vcount,cbtVector3 *overts,uint *ocount,
          uint *indices,uint indexcount)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *__s;
  uint *__s_00;
  long lVar4;
  long lVar5;
  ulong uVar6;
  TUIntArray usedIndices;
  cbtAlignedObjectArray<int> tmpIndices;
  cbtAlignedObjectArray<unsigned_int> local_78;
  cbtAlignedObjectArray<int> local_58;
  size_t local_38;
  
  local_58.m_ownsMemory = true;
  local_58.m_data = (int *)0x0;
  local_58.m_size = 0;
  local_58.m_capacity = 0;
  iVar1 = *(int *)(this + 0x24);
  if ((-1 < (long)iVar1) && (iVar1 != 0)) {
    local_38 = (long)iVar1 << 2;
    __s = (int *)cbtAlignedAllocInternal(local_38,0x10);
    if (0 < (long)local_58.m_size) {
      lVar4 = 0;
      do {
        __s[lVar4] = local_58.m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (local_58.m_size != lVar4);
    }
    if ((local_58.m_data != (int *)0x0) && (local_58.m_ownsMemory == true)) {
      cbtAlignedFreeInternal(local_58.m_data);
    }
    local_58.m_ownsMemory = true;
    local_58.m_data = __s;
    local_58.m_capacity = iVar1;
    if (iVar1 != 0) {
      memset(__s,0,local_38);
    }
  }
  local_58.m_size = iVar1;
  if (0 < *(int *)(this + 0x24)) {
    lVar4 = *(long *)(this + 0x30);
    lVar5 = 0;
    do {
      local_58.m_data[lVar5] = *(int *)(lVar4 + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(this + 0x24));
  }
  local_78.m_ownsMemory = true;
  local_78.m_data = (uint *)0x0;
  local_78.m_size = 0;
  local_78.m_capacity = 0;
  uVar6 = (ulong)vcount;
  if ((-1 < (int)vcount) && (vcount != 0)) {
    __s_00 = (uint *)cbtAlignedAllocInternal(uVar6 * 4,0x10);
    if (0 < (long)local_78.m_size) {
      lVar4 = 0;
      do {
        __s_00[lVar4] = local_78.m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (local_78.m_size != lVar4);
    }
    if ((local_78.m_data != (uint *)0x0) && (local_78.m_ownsMemory == true)) {
      cbtAlignedFreeInternal(local_78.m_data);
    }
    local_78.m_ownsMemory = true;
    local_78.m_data = __s_00;
    local_78.m_capacity = vcount;
    if (vcount != 0) {
      memset(__s_00,0,uVar6 * 4);
    }
  }
  local_78.m_size = vcount;
  memset(local_78.m_data,0,uVar6 << 2);
  *ocount = 0;
  if (0 < (int)indexcount) {
    uVar6 = 0;
    do {
      uVar2 = indices[uVar6];
      if (local_78.m_data[(int)uVar2] == 0) {
        indices[uVar6] = *ocount;
        uVar3 = *ocount;
        overts[uVar3].m_floats[0] = verts[uVar2].m_floats[0];
        overts[uVar3].m_floats[1] = verts[uVar2].m_floats[1];
        overts[uVar3].m_floats[2] = verts[uVar2].m_floats[2];
        if (0 < *(int *)(this + 0x24)) {
          lVar4 = *(long *)(this + 0x30);
          lVar5 = 0;
          do {
            if (local_58.m_data[lVar5] == uVar2) {
              *(uint *)(lVar4 + lVar5 * 4) = *ocount;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < *(int *)(this + 0x24));
        }
        uVar3 = *ocount;
        *ocount = uVar3 + 1;
        local_78.m_data[(int)uVar2] = uVar3 + 1;
      }
      else {
        indices[uVar6] = local_78.m_data[(int)uVar2] - 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != indexcount);
  }
  cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&local_78);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_58);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const cbtVector3 *verts, unsigned int vcount, cbtVector3 *overts, unsigned int &ocount, unsigned int *indices, unsigned indexcount)
{
	cbtAlignedObjectArray<int> tmpIndices;
	tmpIndices.resize(m_vertexIndexMapping.size());
	int i;

	for (i = 0; i < m_vertexIndexMapping.size(); i++)
	{
		tmpIndices[i] = m_vertexIndexMapping[i];
	}

	TUIntArray usedIndices;
	usedIndices.resize(static_cast<int>(vcount));
	memset(&usedIndices[0], 0, sizeof(unsigned int) * vcount);

	ocount = 0;

	for (i = 0; i < int(indexcount); i++)
	{
		unsigned int v = indices[i];  // original array index

		cbtAssert(v >= 0 && v < vcount);

		if (usedIndices[static_cast<int>(v)])  // if already remapped
		{
			indices[i] = usedIndices[static_cast<int>(v)] - 1;  // index to new array
		}
		else
		{
			indices[i] = ocount;  // new index mapping

			overts[ocount][0] = verts[v][0];  // copy old vert to new vert array
			overts[ocount][1] = verts[v][1];
			overts[ocount][2] = verts[v][2];

			for (int k = 0; k < m_vertexIndexMapping.size(); k++)
			{
				if (tmpIndices[k] == int(v))
					m_vertexIndexMapping[k] = ocount;
			}

			ocount++;  // increment output vert count

			cbtAssert(ocount >= 0 && ocount <= vcount);

			usedIndices[static_cast<int>(v)] = ocount;  // assign new index remapping
		}
	}
}